

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::sse2::BVHNIntersector1<4,_16781328,_true,_embree::sse2::VirtualCurveIntersector1>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  int iVar7;
  int iVar8;
  void *pvVar9;
  long lVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 (*pauVar20) [16];
  undefined1 (*pauVar21) [16];
  ulong uVar22;
  uint uVar23;
  void *in_R8;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar50;
  vfloat4 a0;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar74;
  float fVar75;
  float fVar76;
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar78;
  undefined1 auVar70 [16];
  float fVar77;
  float fVar79;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar80;
  undefined1 auVar81 [12];
  float fVar85;
  float fVar86;
  float fVar87;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar88;
  float fVar89;
  float fVar91;
  vfloat4 a;
  float fVar92;
  undefined1 auVar90 [16];
  float fVar93;
  float fVar94;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  undefined1 auVar95 [16];
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  vfloat<4> tNear;
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_10f8 [8];
  float fStack_10f0;
  float fStack_10ec;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  RayHit *local_1080;
  Intersectors *local_1078;
  RayQueryContext *local_1070;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8 [4];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_1070 = context;
  local_1078 = This;
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    aVar6 = (ray->super_RayK<1>).dir.field_0.field_1;
    local_1018 = aVar6.x;
    local_1028 = aVar6.y;
    local_1008 = aVar6.z;
    aVar78 = aVar6.field_3;
    fVar30 = local_1028 * local_1028;
    fVar32 = local_1008 * local_1008;
    fVar34 = aVar78.w * aVar78.w;
    fVar50 = fVar30 + local_1018 * local_1018 + fVar32;
    auVar60._0_8_ = CONCAT44(fVar30 + fVar30 + fVar34,fVar50);
    auVar60._8_4_ = fVar30 + fVar32 + fVar32;
    auVar60._12_4_ = fVar30 + fVar34 + fVar34;
    auVar62._8_4_ = auVar60._8_4_;
    auVar62._0_8_ = auVar60._0_8_;
    auVar62._12_4_ = auVar60._12_4_;
    auVar60 = rsqrtss(auVar62,auVar60);
    fVar30 = auVar60._0_4_;
    local_fb8[0] = fVar30 * 1.5 - fVar30 * fVar30 * fVar50 * 0.5 * fVar30;
    fVar30 = local_1018 * local_fb8[0];
    fVar32 = local_1028 * local_fb8[0];
    fVar34 = local_1008 * local_fb8[0];
    fVar88 = -fVar32;
    fVar50 = -fVar34;
    auVar81._8_4_ = 0xffffffff;
    auVar81._0_8_ = 0xffffffffffffffff;
    if (fVar88 * fVar88 + fVar34 * fVar34 + 0.0 <= fVar30 * fVar30 + fVar50 * fVar50 + 0.0) {
      auVar81 = SUB1612((undefined1  [16])0x0,0);
    }
    fVar74 = (float)((uint)fVar34 & auVar81._4_4_);
    fVar50 = (float)(~auVar81._0_4_ & (uint)fVar50);
    fVar76 = (float)(~auVar81._8_4_ & (uint)fVar30 | (uint)fVar88 & auVar81._8_4_);
    fVar88 = fVar74 * fVar74;
    fVar75 = fVar76 * fVar76;
    fVar89 = fVar88 + fVar50 * fVar50 + fVar75;
    auVar69._0_8_ = CONCAT44(fVar88 + fVar88 + 0.0,fVar89);
    auVar69._8_4_ = fVar88 + fVar75 + fVar75;
    auVar69._12_4_ = fVar88 + 0.0 + 0.0;
    auVar73._8_4_ = auVar69._8_4_;
    auVar73._0_8_ = auVar69._0_8_;
    auVar73._12_4_ = auVar69._12_4_;
    auVar60 = rsqrtss(auVar73,auVar69);
    fVar88 = auVar60._0_4_;
    fVar88 = fVar88 * 1.5 - fVar88 * fVar88 * fVar89 * 0.5 * fVar88;
    fVar50 = fVar88 * fVar50;
    fVar74 = fVar88 * fVar74;
    fVar76 = fVar88 * fVar76;
    fVar75 = fVar74 * fVar30 - fVar32 * fVar50;
    fVar89 = fVar76 * fVar32 - fVar34 * fVar74;
    fVar85 = fVar50 * fVar34 - fVar30 * fVar76;
    fVar87 = fVar88 * 0.0 * aVar78.w * local_fb8[0] - aVar78.w * local_fb8[0] * fVar88 * 0.0;
    fVar88 = fVar89 * fVar89;
    fVar86 = fVar85 * fVar85;
    fVar87 = fVar87 * fVar87;
    fVar93 = fVar86 + fVar88 + fVar75 * fVar75;
    auVar84._0_8_ = CONCAT44(fVar87 + fVar88 + fVar88,fVar93);
    auVar84._8_4_ = fVar86 + fVar88 + fVar86;
    auVar84._12_4_ = fVar87 + fVar88 + fVar87;
    auVar58._8_4_ = auVar84._8_4_;
    auVar58._0_8_ = auVar84._0_8_;
    auVar58._12_4_ = auVar84._12_4_;
    auVar60 = rsqrtss(auVar58,auVar84);
    fVar88 = auVar60._0_4_;
    fVar88 = fVar88 * 1.5 - fVar88 * fVar88 * fVar93 * 0.5 * fVar88;
    local_f88._4_4_ = fVar88 * fVar75;
    local_f88._0_4_ = fVar76;
    local_f88._8_4_ = local_fb8[0] * fVar34;
    local_f88._12_4_ = 0;
    local_f98._4_4_ = fVar88 * fVar85;
    local_f98._0_4_ = fVar74;
    local_f98._8_4_ = local_fb8[0] * fVar32;
    local_f98._12_4_ = 0;
    local_fa8._4_4_ = fVar88 * fVar89;
    local_fa8._0_4_ = fVar50;
    local_fa8._8_4_ = local_fb8[0] * fVar30;
    local_fa8._12_4_ = 0;
    pauVar21 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    fVar30 = (ray->super_RayK<1>).org.field_0.m128[0];
    fVar32 = (ray->super_RayK<1>).org.field_0.m128[1];
    fVar34 = (ray->super_RayK<1>).org.field_0.m128[2];
    fVar50 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    fVar88 = 0.0;
    if (0.0 <= fVar50) {
      fVar88 = fVar50;
    }
    fVar50 = (ray->super_RayK<1>).tfar;
    fVar74 = 0.0;
    if (0.0 <= fVar50) {
      fVar74 = fVar50;
    }
    auVar60 = divps(_DAT_01f7ba10,(undefined1  [16])aVar6);
    fVar94 = (float)(~-(uint)(1e-18 <= ABS(local_1018)) & 0x5d5e0b6b |
                    auVar60._0_4_ & -(uint)(1e-18 <= ABS(local_1018)));
    fVar96 = (float)(~-(uint)(1e-18 <= ABS(local_1028)) & 0x5d5e0b6b |
                    auVar60._4_4_ & -(uint)(1e-18 <= ABS(local_1028)));
    fVar98 = (float)(~-(uint)(1e-18 <= ABS(local_1008)) & 0x5d5e0b6b |
                    auVar60._8_4_ & -(uint)(1e-18 <= ABS(local_1008)));
    fVar50 = fVar94 * 0.99999964;
    fVar102 = fVar96 * 0.99999964;
    fVar104 = fVar98 * 0.99999964;
    fVar94 = fVar94 * 1.0000004;
    fVar96 = fVar96 * 1.0000004;
    fVar98 = fVar98 * 1.0000004;
    fStack_1014 = local_1018;
    fStack_1010 = local_1018;
    fStack_100c = local_1018;
    fStack_1024 = local_1028;
    fStack_1020 = local_1028;
    fStack_101c = local_1028;
    fStack_1004 = local_1008;
    fStack_1000 = local_1008;
    fStack_ffc = local_1008;
    uVar24 = (ulong)(fVar50 < 0.0) * 0x10;
    uVar26 = (ulong)(fVar102 < 0.0) << 4 | 0x20;
    uVar25 = (ulong)(fVar104 < 0.0) << 4 | 0x40;
    local_10d8 = fVar34;
    fStack_10d4 = fVar34;
    fStack_10d0 = fVar34;
    fStack_10cc = fVar34;
    local_1038 = fVar88;
    fStack_1034 = fVar88;
    fStack_1030 = fVar88;
    fStack_102c = fVar88;
    local_1048 = fVar98;
    fStack_1044 = fVar98;
    fStack_1040 = fVar98;
    fStack_103c = fVar98;
    local_1058 = fVar104;
    fStack_1054 = fVar104;
    fStack_1050 = fVar104;
    fStack_104c = fVar104;
    local_1068 = fVar50;
    fStack_1064 = fVar50;
    fStack_1060 = fVar50;
    fStack_105c = fVar50;
    local_10b8 = fVar102;
    fStack_10b4 = fVar102;
    fStack_10b0 = fVar102;
    fStack_10ac = fVar102;
    local_10c8 = fVar94;
    fStack_10c4 = fVar94;
    fStack_10c0 = fVar94;
    fStack_10bc = fVar94;
    local_10e8 = fVar96;
    fStack_10e4 = fVar96;
    fStack_10e0 = fVar96;
    fStack_10dc = fVar96;
    local_1080 = ray;
    fVar31 = fVar74;
    fVar33 = fVar74;
    fVar35 = fVar74;
    fVar75 = fVar50;
    fVar76 = fVar50;
    fVar89 = fVar50;
    fVar85 = fVar88;
    fVar86 = fVar88;
    fVar87 = fVar88;
    fVar93 = fVar34;
    fVar77 = fVar34;
    fVar79 = fVar34;
    fVar80 = fVar104;
    fVar101 = fVar104;
    fVar103 = fVar104;
    fVar105 = fVar96;
    fVar106 = fVar96;
    fVar107 = fVar96;
    fVar108 = fVar102;
    fVar109 = fVar102;
    fVar110 = fVar102;
    fVar111 = fVar94;
    fVar91 = fVar94;
    fVar92 = fVar94;
    fVar97 = fVar98;
    fVar99 = fVar98;
    fVar100 = fVar98;
    do {
      pauVar20 = pauVar21 + -1;
      pauVar21 = pauVar21 + -1;
      pfVar1 = &(ray->super_RayK<1>).tfar;
      if (*(float *)((long)*pauVar20 + 8) < *pfVar1 || *(float *)((long)*pauVar20 + 8) == *pfVar1) {
        pvVar9 = *(void **)*pauVar21;
        while (((ulong)pvVar9 & 8) == 0) {
          fVar5 = (ray->super_RayK<1>).dir.field_0.m128[3];
          uVar23 = (uint)pvVar9 & 7;
          uVar22 = (ulong)pvVar9 & 0xfffffffffffffff0;
          if (uVar23 == 3) {
            local_fd8 = *(float *)(uVar22 + 0x70);
            fStack_fd4 = *(float *)(uVar22 + 0x74);
            fStack_fd0 = *(float *)(uVar22 + 0x78);
            fStack_fcc = *(float *)(uVar22 + 0x7c);
            local_ff8 = *(float *)(uVar22 + 0x80);
            fStack_ff4 = *(float *)(uVar22 + 0x84);
            fStack_ff0 = *(float *)(uVar22 + 0x88);
            fStack_fec = *(float *)(uVar22 + 0x8c);
            local_fe8 = *(float *)(uVar22 + 0x90);
            fStack_fe4 = *(float *)(uVar22 + 0x94);
            fStack_fe0 = *(float *)(uVar22 + 0x98);
            fStack_fdc = *(float *)(uVar22 + 0x9c);
            local_fc8 = *(float *)(uVar22 + 0xa0);
            fStack_fc4 = *(float *)(uVar22 + 0xa4);
            fStack_fc0 = *(float *)(uVar22 + 0xa8);
            fStack_fbc = *(float *)(uVar22 + 0xac);
            fVar104 = 1.0 - fVar5;
            fVar80 = fVar104 * 0.0;
            fVar34 = local_1018 * *(float *)(uVar22 + 0x20) +
                     local_1028 * *(float *)(uVar22 + 0x50) + local_1008 * local_ff8;
            fVar50 = fStack_1014 * *(float *)(uVar22 + 0x24) +
                     fStack_1024 * *(float *)(uVar22 + 0x54) + fStack_1004 * fStack_ff4;
            fVar88 = fStack_1010 * *(float *)(uVar22 + 0x28) +
                     fStack_1020 * *(float *)(uVar22 + 0x58) + fStack_1000 * fStack_ff0;
            fVar75 = fStack_100c * *(float *)(uVar22 + 0x2c) +
                     fStack_101c * *(float *)(uVar22 + 0x5c) + fStack_ffc * fStack_fec;
            fVar76 = local_1018 * *(float *)(uVar22 + 0x30) +
                     local_1028 * *(float *)(uVar22 + 0x60) + local_1008 * local_fe8;
            fVar89 = fStack_1014 * *(float *)(uVar22 + 0x34) +
                     fStack_1024 * *(float *)(uVar22 + 100) + fStack_1004 * fStack_fe4;
            fVar85 = fStack_1010 * *(float *)(uVar22 + 0x38) +
                     fStack_1020 * *(float *)(uVar22 + 0x68) + fStack_1000 * fStack_fe0;
            fVar86 = fStack_100c * *(float *)(uVar22 + 0x3c) +
                     fStack_101c * *(float *)(uVar22 + 0x6c) + fStack_ffc * fStack_fdc;
            fVar87 = local_1018 * *(float *)(uVar22 + 0x40) +
                     local_1028 * local_fd8 + local_1008 * local_fc8;
            fVar93 = fStack_1014 * *(float *)(uVar22 + 0x44) +
                     fStack_1024 * fStack_fd4 + fStack_1004 * fStack_fc4;
            fVar77 = fStack_1010 * *(float *)(uVar22 + 0x48) +
                     fStack_1020 * fStack_fd0 + fStack_1000 * fStack_fc0;
            fVar79 = fStack_100c * *(float *)(uVar22 + 0x4c) +
                     fStack_101c * fStack_fcc + fStack_ffc * fStack_fbc;
            uVar23 = -(uint)(1e-18 <= ABS(fVar34));
            uVar27 = -(uint)(1e-18 <= ABS(fVar50));
            uVar28 = -(uint)(1e-18 <= ABS(fVar88));
            uVar29 = -(uint)(1e-18 <= ABS(fVar75));
            auVar44._0_4_ = (uint)fVar34 & uVar23;
            auVar44._4_4_ = (uint)fVar50 & uVar27;
            auVar44._8_4_ = (uint)fVar88 & uVar28;
            auVar44._12_4_ = (uint)fVar75 & uVar29;
            auVar54._0_8_ = CONCAT44(~uVar27,~uVar23) & 0x219392ef219392ef;
            auVar54._8_4_ = ~uVar28 & 0x219392ef;
            auVar54._12_4_ = ~uVar29 & 0x219392ef;
            auVar54 = auVar54 | auVar44;
            uVar23 = -(uint)(1e-18 <= ABS(fVar76));
            uVar27 = -(uint)(1e-18 <= ABS(fVar89));
            uVar28 = -(uint)(1e-18 <= ABS(fVar85));
            uVar29 = -(uint)(1e-18 <= ABS(fVar86));
            auVar64._0_4_ = (uint)fVar76 & uVar23;
            auVar64._4_4_ = (uint)fVar89 & uVar27;
            auVar64._8_4_ = (uint)fVar85 & uVar28;
            auVar64._12_4_ = (uint)fVar86 & uVar29;
            auVar45._0_8_ = CONCAT44(~uVar27,~uVar23) & 0x219392ef219392ef;
            auVar45._8_4_ = ~uVar28 & 0x219392ef;
            auVar45._12_4_ = ~uVar29 & 0x219392ef;
            auVar45 = auVar45 | auVar64;
            uVar23 = -(uint)(1e-18 <= ABS(fVar87));
            uVar27 = -(uint)(1e-18 <= ABS(fVar93));
            uVar28 = -(uint)(1e-18 <= ABS(fVar77));
            uVar29 = -(uint)(1e-18 <= ABS(fVar79));
            auVar71._0_4_ = (uint)fVar87 & uVar23;
            auVar71._4_4_ = (uint)fVar93 & uVar27;
            auVar71._8_4_ = (uint)fVar77 & uVar28;
            auVar71._12_4_ = (uint)fVar79 & uVar29;
            auVar65._0_8_ = CONCAT44(~uVar27,~uVar23) & 0x219392ef219392ef;
            auVar65._8_4_ = ~uVar28 & 0x219392ef;
            auVar65._12_4_ = ~uVar29 & 0x219392ef;
            auVar65 = auVar65 | auVar71;
            auVar60 = rcpps(auVar71,auVar54);
            fVar87 = auVar60._0_4_;
            fVar93 = auVar60._4_4_;
            fVar77 = auVar60._8_4_;
            fVar79 = auVar60._12_4_;
            fVar87 = (1.0 - auVar54._0_4_ * fVar87) * fVar87 + fVar87;
            fVar93 = (1.0 - auVar54._4_4_ * fVar93) * fVar93 + fVar93;
            fVar77 = (1.0 - auVar54._8_4_ * fVar77) * fVar77 + fVar77;
            fVar79 = (1.0 - auVar54._12_4_ * fVar79) * fVar79 + fVar79;
            auVar60 = rcpps(auVar60,auVar45);
            fVar76 = auVar60._0_4_;
            fVar89 = auVar60._4_4_;
            fVar85 = auVar60._8_4_;
            fVar86 = auVar60._12_4_;
            fVar76 = (1.0 - auVar45._0_4_ * fVar76) * fVar76 + fVar76;
            fVar89 = (1.0 - auVar45._4_4_ * fVar89) * fVar89 + fVar89;
            fVar85 = (1.0 - auVar45._8_4_ * fVar85) * fVar85 + fVar85;
            fVar86 = (1.0 - auVar45._12_4_ * fVar86) * fVar86 + fVar86;
            auVar60 = rcpps(auVar60,auVar65);
            fVar34 = auVar60._0_4_;
            fVar50 = auVar60._4_4_;
            fVar88 = auVar60._8_4_;
            fVar75 = auVar60._12_4_;
            fVar34 = (1.0 - auVar65._0_4_ * fVar34) * fVar34 + fVar34;
            fVar50 = (1.0 - auVar65._4_4_ * fVar50) * fVar50 + fVar50;
            fVar88 = (1.0 - auVar65._8_4_ * fVar88) * fVar88 + fVar88;
            fVar75 = (1.0 - auVar65._12_4_ * fVar75) * fVar75 + fVar75;
            local_10a8 = *(float *)(uVar22 + 0x50) * fVar32 +
                         local_ff8 * local_10d8 + *(float *)(uVar22 + 0xb0);
            fStack_10a4 = *(float *)(uVar22 + 0x54) * fVar32 +
                          fStack_ff4 * fStack_10d4 + *(float *)(uVar22 + 0xb4);
            fStack_10a0 = *(float *)(uVar22 + 0x58) * fVar32 +
                          fStack_ff0 * fStack_10d0 + *(float *)(uVar22 + 0xb8);
            fStack_109c = *(float *)(uVar22 + 0x5c) * fVar32 +
                          fStack_fec * fStack_10cc + *(float *)(uVar22 + 0xbc);
            local_1098 = *(float *)(uVar22 + 0x60) * fVar32 +
                         local_fe8 * local_10d8 + *(float *)(uVar22 + 0xc0);
            fStack_1094 = *(float *)(uVar22 + 100) * fVar32 +
                          fStack_fe4 * fStack_10d4 + *(float *)(uVar22 + 0xc4);
            fStack_1090 = *(float *)(uVar22 + 0x68) * fVar32 +
                          fStack_fe0 * fStack_10d0 + *(float *)(uVar22 + 200);
            fStack_108c = *(float *)(uVar22 + 0x6c) * fVar32 +
                          fStack_fdc * fStack_10cc + *(float *)(uVar22 + 0xcc);
            fVar101 = *(float *)(uVar22 + 0x20) * fVar30 + local_10a8;
            fVar103 = *(float *)(uVar22 + 0x24) * fVar30 + fStack_10a4;
            fVar96 = *(float *)(uVar22 + 0x28) * fVar30 + fStack_10a0;
            fVar105 = *(float *)(uVar22 + 0x2c) * fVar30 + fStack_109c;
            fVar106 = *(float *)(uVar22 + 0x30) * fVar30 + local_1098;
            fVar107 = *(float *)(uVar22 + 0x34) * fVar30 + fStack_1094;
            fVar102 = *(float *)(uVar22 + 0x38) * fVar30 + fStack_1090;
            fVar108 = *(float *)(uVar22 + 0x3c) * fVar30 + fStack_108c;
            fVar109 = *(float *)(uVar22 + 0x40) * fVar30 +
                      local_fd8 * fVar32 + local_fc8 * local_10d8 + *(float *)(uVar22 + 0xd0);
            fVar110 = *(float *)(uVar22 + 0x44) * fVar30 +
                      fStack_fd4 * fVar32 + fStack_fc4 * fStack_10d4 + *(float *)(uVar22 + 0xd4);
            fVar94 = *(float *)(uVar22 + 0x48) * fVar30 +
                     fStack_fd0 * fVar32 + fStack_fc0 * fStack_10d0 + *(float *)(uVar22 + 0xd8);
            fVar111 = *(float *)(uVar22 + 0x4c) * fVar30 +
                      fStack_fcc * fVar32 + fStack_fbc * fStack_10cc + *(float *)(uVar22 + 0xdc);
            auVar95._0_8_ =
                 CONCAT44(((*(float *)(uVar22 + 0xe4) * fVar5 + fVar80) - fVar103) * fVar93,
                          ((*(float *)(uVar22 + 0xe0) * fVar5 + fVar80) - fVar101) * fVar87);
            auVar95._8_4_ = ((*(float *)(uVar22 + 0xe8) * fVar5 + fVar80) - fVar96) * fVar77;
            auVar95._12_4_ = ((*(float *)(uVar22 + 0xec) * fVar5 + fVar80) - fVar105) * fVar79;
            fVar87 = ((*(float *)(uVar22 + 0x110) * fVar5 + fVar104) - fVar101) * fVar87;
            fVar93 = ((*(float *)(uVar22 + 0x114) * fVar5 + fVar104) - fVar103) * fVar93;
            fVar77 = ((*(float *)(uVar22 + 0x118) * fVar5 + fVar104) - fVar96) * fVar77;
            fVar79 = ((*(float *)(uVar22 + 0x11c) * fVar5 + fVar104) - fVar105) * fVar79;
            auVar90._0_8_ =
                 CONCAT44(((*(float *)(uVar22 + 0xf4) * fVar5 + fVar80) - fVar107) * fVar89,
                          ((*(float *)(uVar22 + 0xf0) * fVar5 + fVar80) - fVar106) * fVar76);
            auVar90._8_4_ = ((*(float *)(uVar22 + 0xf8) * fVar5 + fVar80) - fVar102) * fVar85;
            auVar90._12_4_ = ((*(float *)(uVar22 + 0xfc) * fVar5 + fVar80) - fVar108) * fVar86;
            auVar82._0_8_ =
                 CONCAT44(((fVar80 + *(float *)(uVar22 + 0x104) * fVar5) - fVar110) * fVar50,
                          ((fVar80 + *(float *)(uVar22 + 0x100) * fVar5) - fVar109) * fVar34);
            auVar82._8_4_ = ((fVar80 + *(float *)(uVar22 + 0x108) * fVar5) - fVar94) * fVar88;
            auVar82._12_4_ = ((fVar80 + *(float *)(uVar22 + 0x10c) * fVar5) - fVar111) * fVar75;
            fVar76 = ((*(float *)(uVar22 + 0x120) * fVar5 + fVar104) - fVar106) * fVar76;
            fVar89 = ((*(float *)(uVar22 + 0x124) * fVar5 + fVar104) - fVar107) * fVar89;
            fVar85 = ((*(float *)(uVar22 + 0x128) * fVar5 + fVar104) - fVar102) * fVar85;
            fVar86 = ((*(float *)(uVar22 + 300) * fVar5 + fVar104) - fVar108) * fVar86;
            auVar37._0_4_ = ((fVar5 * *(float *)(uVar22 + 0x130) + fVar104) - fVar109) * fVar34;
            auVar37._4_4_ = ((fVar5 * *(float *)(uVar22 + 0x134) + fVar104) - fVar110) * fVar50;
            auVar37._8_4_ = ((fVar5 * *(float *)(uVar22 + 0x138) + fVar104) - fVar94) * fVar88;
            auVar37._12_4_ = ((fVar5 * *(float *)(uVar22 + 0x13c) + fVar104) - fVar111) * fVar75;
            auVar46._8_4_ = auVar90._8_4_;
            auVar46._0_8_ = auVar90._0_8_;
            auVar46._12_4_ = auVar90._12_4_;
            auVar15._4_4_ = fVar89;
            auVar15._0_4_ = fVar76;
            auVar15._8_4_ = fVar85;
            auVar15._12_4_ = fVar86;
            auVar60 = minps(auVar46,auVar15);
            auVar55._8_4_ = auVar82._8_4_;
            auVar55._0_8_ = auVar82._0_8_;
            auVar55._12_4_ = auVar82._12_4_;
            auVar62 = minps(auVar55,auVar37);
            auVar62 = maxps(auVar60,auVar62);
            auVar56._8_4_ = auVar95._8_4_;
            auVar56._0_8_ = auVar95._0_8_;
            auVar56._12_4_ = auVar95._12_4_;
            auVar17._4_4_ = fVar93;
            auVar17._0_4_ = fVar87;
            auVar17._8_4_ = fVar77;
            auVar17._12_4_ = fVar79;
            auVar60 = minps(auVar56,auVar17);
            auVar18._4_4_ = fVar93;
            auVar18._0_4_ = fVar87;
            auVar18._8_4_ = fVar77;
            auVar18._12_4_ = fVar79;
            auVar73 = maxps(auVar95,auVar18);
            auVar19._4_4_ = fStack_1034;
            auVar19._0_4_ = local_1038;
            auVar19._8_4_ = fStack_1030;
            auVar19._12_4_ = fStack_102c;
            auVar16._4_4_ = fVar89;
            auVar16._0_4_ = fVar76;
            auVar16._8_4_ = fVar85;
            auVar16._12_4_ = fVar86;
            auVar69 = maxps(auVar90,auVar16);
            auVar58 = maxps(auVar82,auVar37);
            auVar58 = minps(auVar69,auVar58);
            auVar60 = maxps(auVar19,auVar60);
            auVar60 = maxps(auVar60,auVar62);
            auVar47._4_4_ = fVar31;
            auVar47._0_4_ = fVar74;
            auVar47._8_4_ = fVar33;
            auVar47._12_4_ = fVar35;
            auVar62 = minps(auVar47,auVar73);
            auVar62 = minps(auVar62,auVar58);
            local_10f8._0_4_ = auVar60._0_4_ * 0.99999964;
            local_10f8._4_4_ = auVar60._4_4_ * 0.99999964;
            fStack_10f0 = auVar60._8_4_ * 0.99999964;
            fStack_10ec = auVar60._12_4_ * 0.99999964;
            auVar38._4_4_ = -(uint)((float)local_10f8._4_4_ <= auVar62._4_4_ * 1.0000004);
            auVar38._0_4_ = -(uint)((float)local_10f8._0_4_ <= auVar62._0_4_ * 1.0000004);
            auVar38._8_4_ = -(uint)(fStack_10f0 <= auVar62._8_4_ * 1.0000004);
            auVar38._12_4_ = -(uint)(fStack_10ec <= auVar62._12_4_ * 1.0000004);
            uVar23 = movmskps((int)in_R8,auVar38);
            fVar50 = local_1068;
            fVar75 = fStack_1064;
            fVar76 = fStack_1060;
            fVar89 = fStack_105c;
            fVar88 = local_1038;
            fVar85 = fStack_1034;
            fVar86 = fStack_1030;
            fVar87 = fStack_102c;
            fVar34 = local_10d8;
            fVar93 = fStack_10d4;
            fVar77 = fStack_10d0;
            fVar79 = fStack_10cc;
            fVar104 = local_1058;
            fVar80 = fStack_1054;
            fVar101 = fStack_1050;
            fVar103 = fStack_104c;
            fVar96 = local_10e8;
            fVar105 = fStack_10e4;
            fVar106 = fStack_10e0;
            fVar107 = fStack_10dc;
            fVar102 = local_10b8;
            fVar108 = fStack_10b4;
            fVar109 = fStack_10b0;
            fVar110 = fStack_10ac;
            fVar94 = local_10c8;
            fVar111 = fStack_10c4;
            fVar91 = fStack_10c0;
            fVar92 = fStack_10bc;
            fVar98 = local_1048;
            fVar97 = fStack_1044;
            fVar99 = fStack_1040;
            fVar100 = fStack_103c;
          }
          else {
            pfVar3 = (float *)(uVar22 + 0x80 + uVar24);
            pfVar1 = (float *)(uVar22 + 0x20 + uVar24);
            pfVar4 = (float *)(uVar22 + 0x80 + uVar26);
            pfVar2 = (float *)(uVar22 + 0x20 + uVar26);
            auVar51._0_4_ = ((*pfVar3 * fVar5 + *pfVar1) - fVar30) * fVar50;
            auVar51._4_4_ = ((pfVar3[1] * fVar5 + pfVar1[1]) - fVar30) * fVar75;
            auVar51._8_4_ = ((pfVar3[2] * fVar5 + pfVar1[2]) - fVar30) * fVar76;
            auVar51._12_4_ = ((pfVar3[3] * fVar5 + pfVar1[3]) - fVar30) * fVar89;
            auVar61._0_4_ = ((*pfVar4 * fVar5 + *pfVar2) - fVar32) * fVar102;
            auVar61._4_4_ = ((pfVar4[1] * fVar5 + pfVar2[1]) - fVar32) * fVar108;
            auVar61._8_4_ = ((pfVar4[2] * fVar5 + pfVar2[2]) - fVar32) * fVar109;
            auVar61._12_4_ = ((pfVar4[3] * fVar5 + pfVar2[3]) - fVar32) * fVar110;
            pfVar2 = (float *)(uVar22 + 0x80 + uVar25);
            pfVar1 = (float *)(uVar22 + 0x20 + uVar25);
            auVar42._0_4_ = ((*pfVar2 * fVar5 + *pfVar1) - fVar34) * fVar104;
            auVar42._4_4_ = ((pfVar2[1] * fVar5 + pfVar1[1]) - fVar93) * fVar80;
            auVar42._8_4_ = ((pfVar2[2] * fVar5 + pfVar1[2]) - fVar77) * fVar101;
            auVar42._12_4_ = ((pfVar2[3] * fVar5 + pfVar1[3]) - fVar79) * fVar103;
            auVar62 = maxps(auVar61,auVar42);
            auVar43._4_4_ = fVar85;
            auVar43._0_4_ = fVar88;
            auVar43._8_4_ = fVar86;
            auVar43._12_4_ = fVar87;
            auVar60 = maxps(auVar43,auVar51);
            pfVar2 = (float *)(uVar22 + 0x80 + (uVar24 ^ 0x10));
            pfVar1 = (float *)(uVar22 + 0x20 + (uVar24 ^ 0x10));
            _local_10f8 = maxps(auVar60,auVar62);
            auVar70._0_4_ = ((*pfVar2 * fVar5 + *pfVar1) - fVar30) * fVar94;
            auVar70._4_4_ = ((pfVar2[1] * fVar5 + pfVar1[1]) - fVar30) * fVar111;
            auVar70._8_4_ = ((pfVar2[2] * fVar5 + pfVar1[2]) - fVar30) * fVar91;
            auVar70._12_4_ = ((pfVar2[3] * fVar5 + pfVar1[3]) - fVar30) * fVar92;
            pfVar3 = (float *)(uVar22 + 0x80 + (uVar26 ^ 0x10));
            pfVar1 = (float *)(uVar22 + 0x20 + (uVar26 ^ 0x10));
            pfVar4 = (float *)(uVar22 + 0x80 + (uVar25 ^ 0x10));
            pfVar2 = (float *)(uVar22 + 0x20 + (uVar25 ^ 0x10));
            auVar63._0_4_ = ((*pfVar3 * fVar5 + *pfVar1) - fVar32) * fVar96;
            auVar63._4_4_ = ((pfVar3[1] * fVar5 + pfVar1[1]) - fVar32) * fVar105;
            auVar63._8_4_ = ((pfVar3[2] * fVar5 + pfVar1[2]) - fVar32) * fVar106;
            auVar63._12_4_ = ((pfVar3[3] * fVar5 + pfVar1[3]) - fVar32) * fVar107;
            auVar52._0_4_ = ((*pfVar4 * fVar5 + *pfVar2) - fVar34) * fVar98;
            auVar52._4_4_ = ((pfVar4[1] * fVar5 + pfVar2[1]) - fVar93) * fVar97;
            auVar52._8_4_ = ((pfVar4[2] * fVar5 + pfVar2[2]) - fVar77) * fVar99;
            auVar52._12_4_ = ((pfVar4[3] * fVar5 + pfVar2[3]) - fVar79) * fVar100;
            auVar62 = minps(auVar63,auVar52);
            auVar53._4_4_ = fVar31;
            auVar53._0_4_ = fVar74;
            auVar53._8_4_ = fVar33;
            auVar53._12_4_ = fVar35;
            auVar60 = minps(auVar53,auVar70);
            auVar60 = minps(auVar60,auVar62);
            if (uVar23 == 6) {
              bVar11 = (fVar5 < *(float *)(uVar22 + 0xf0) && *(float *)(uVar22 + 0xe0) <= fVar5) &&
                       local_10f8._0_4_ <= auVar60._0_4_;
              bVar12 = (fVar5 < *(float *)(uVar22 + 0xf4) && *(float *)(uVar22 + 0xe4) <= fVar5) &&
                       local_10f8._4_4_ <= auVar60._4_4_;
              bVar13 = (fVar5 < *(float *)(uVar22 + 0xf8) && *(float *)(uVar22 + 0xe8) <= fVar5) &&
                       local_10f8._8_4_ <= auVar60._8_4_;
              bVar14 = (fVar5 < *(float *)(uVar22 + 0xfc) && *(float *)(uVar22 + 0xec) <= fVar5) &&
                       local_10f8._12_4_ <= auVar60._12_4_;
            }
            else {
              bVar11 = local_10f8._0_4_ <= auVar60._0_4_;
              bVar12 = local_10f8._4_4_ <= auVar60._4_4_;
              bVar13 = local_10f8._8_4_ <= auVar60._8_4_;
              bVar14 = local_10f8._12_4_ <= auVar60._12_4_;
            }
            auVar36._0_4_ = (uint)bVar11 * -0x80000000;
            auVar36._4_4_ = (uint)bVar12 * -0x80000000;
            auVar36._8_4_ = (uint)bVar13 * -0x80000000;
            auVar36._12_4_ = (uint)bVar14 * -0x80000000;
            uVar23 = movmskps((int)in_R8,auVar36);
          }
          in_R8 = (void *)CONCAT44((int)((ulong)in_R8 >> 0x20),uVar23);
          if (in_R8 == (void *)0x0) goto LAB_00d00c5b;
          lVar10 = 0;
          if (in_R8 != (void *)0x0) {
            for (; ((ulong)in_R8 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
            }
          }
          pvVar9 = *(void **)(uVar22 + lVar10 * 8);
          uVar23 = uVar23 - 1 & uVar23;
          if (uVar23 != 0) {
            uVar27 = *(uint *)(local_10f8 + lVar10 * 4);
            lVar10 = 0;
            if (uVar23 != 0) {
              for (; (uVar23 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
              }
            }
            in_R8 = *(void **)(uVar22 + lVar10 * 8);
            uVar28 = *(uint *)(local_10f8 + lVar10 * 4);
            uVar23 = uVar23 - 1 & uVar23;
            if (uVar23 == 0) {
              if (uVar27 < uVar28) {
                *(void **)*pauVar21 = in_R8;
                *(uint *)((long)*pauVar21 + 8) = uVar28;
                pauVar21 = pauVar21 + 1;
              }
              else {
                *(void **)*pauVar21 = pvVar9;
                *(uint *)((long)*pauVar21 + 8) = uVar27;
                pauVar21 = pauVar21 + 1;
                pvVar9 = in_R8;
              }
            }
            else {
              auVar39._8_4_ = uVar27;
              auVar39._0_8_ = pvVar9;
              auVar39._12_4_ = 0;
              auVar48._8_4_ = uVar28;
              auVar48._0_8_ = in_R8;
              auVar48._12_4_ = 0;
              lVar10 = 0;
              if (uVar23 != 0) {
                for (; (uVar23 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
                }
              }
              in_R8 = *(void **)(uVar22 + lVar10 * 8);
              iVar7 = *(int *)(local_10f8 + lVar10 * 4);
              auVar57._8_4_ = iVar7;
              auVar57._0_8_ = in_R8;
              auVar57._12_4_ = 0;
              auVar66._8_4_ = -(uint)((int)uVar27 < (int)uVar28);
              uVar23 = uVar23 - 1 & uVar23;
              if (uVar23 == 0) {
                auVar66._4_4_ = auVar66._8_4_;
                auVar66._0_4_ = auVar66._8_4_;
                auVar66._12_4_ = auVar66._8_4_;
                auVar60 = auVar39 & auVar66 | ~auVar66 & auVar48;
                auVar62 = auVar48 & auVar66 | ~auVar66 & auVar39;
                auVar67._8_4_ = -(uint)(auVar60._8_4_ < iVar7);
                auVar67._0_8_ = CONCAT44(auVar67._8_4_,auVar67._8_4_);
                auVar67._12_4_ = auVar67._8_4_;
                auVar58 = auVar57 & auVar67 | ~auVar67 & auVar60;
                auVar40._8_4_ = -(uint)(auVar62._8_4_ < auVar58._8_4_);
                auVar40._4_4_ = auVar40._8_4_;
                auVar40._0_4_ = auVar40._8_4_;
                auVar40._12_4_ = auVar40._8_4_;
                *pauVar21 = ~auVar40 & auVar62 | auVar58 & auVar40;
                pauVar21[1] = auVar62 & auVar40 | ~auVar40 & auVar58;
                pauVar21 = pauVar21 + 2;
                pvVar9 = (void *)(~auVar67._0_8_ & (ulong)in_R8 | auVar60._0_8_ & auVar67._0_8_);
                fVar96 = local_10e8;
                fVar105 = fStack_10e4;
                fVar106 = fStack_10e0;
                fVar107 = fStack_10dc;
              }
              else {
                lVar10 = 0;
                if (uVar23 != 0) {
                  for (; (uVar23 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
                  }
                }
                iVar8 = *(int *)(local_10f8 + lVar10 * 4);
                auVar72._8_4_ = iVar8;
                auVar72._0_8_ = *(undefined8 *)(uVar22 + lVar10 * 8);
                auVar72._12_4_ = 0;
                auVar68._4_4_ = auVar66._8_4_;
                auVar68._0_4_ = auVar66._8_4_;
                auVar68._8_4_ = auVar66._8_4_;
                auVar68._12_4_ = auVar66._8_4_;
                auVar60 = auVar39 & auVar68 | ~auVar68 & auVar48;
                auVar62 = auVar48 & auVar68 | ~auVar68 & auVar39;
                auVar83._0_4_ = -(uint)(iVar7 < iVar8);
                auVar83._4_4_ = -(uint)(iVar7 < iVar8);
                auVar83._8_4_ = -(uint)(iVar7 < iVar8);
                auVar83._12_4_ = -(uint)(iVar7 < iVar8);
                auVar69 = auVar57 & auVar83 | ~auVar83 & auVar72;
                auVar84 = ~auVar83 & auVar57 | auVar72 & auVar83;
                auVar59._8_4_ = -(uint)(auVar62._8_4_ < auVar84._8_4_);
                auVar59._4_4_ = auVar59._8_4_;
                auVar59._0_4_ = auVar59._8_4_;
                auVar59._12_4_ = auVar59._8_4_;
                auVar73 = auVar62 & auVar59 | ~auVar59 & auVar84;
                auVar49._8_4_ = -(uint)(auVar60._8_4_ < auVar69._8_4_);
                auVar49._0_8_ = CONCAT44(auVar49._8_4_,auVar49._8_4_);
                auVar49._12_4_ = auVar49._8_4_;
                auVar58 = ~auVar49 & auVar60 | auVar69 & auVar49;
                auVar41._8_4_ = -(uint)(auVar58._8_4_ < auVar73._8_4_);
                auVar41._4_4_ = auVar41._8_4_;
                auVar41._0_4_ = auVar41._8_4_;
                auVar41._12_4_ = auVar41._8_4_;
                *pauVar21 = ~auVar59 & auVar62 | auVar84 & auVar59;
                pauVar21[1] = ~auVar41 & auVar58 | auVar73 & auVar41;
                pauVar21[2] = auVar58 & auVar41 | ~auVar41 & auVar73;
                pauVar21 = pauVar21 + 3;
                pvVar9 = (void *)(auVar60._0_8_ & auVar49._0_8_ | ~auVar49._0_8_ & auVar69._0_8_);
                fVar96 = local_10e8;
                fVar105 = fStack_10e4;
                fVar106 = fStack_10e0;
                fVar107 = fStack_10dc;
                fVar102 = local_10b8;
                fVar108 = fStack_10b4;
                fVar109 = fStack_10b0;
                fVar110 = fStack_10ac;
                fVar94 = local_10c8;
                fVar111 = fStack_10c4;
                fVar91 = fStack_10c0;
                fVar92 = fStack_10bc;
              }
            }
          }
        }
        in_R8 = local_1078->leafIntersector;
        (**(code **)((long)in_R8 + (ulong)*(byte *)((ulong)pvVar9 & 0xfffffffffffffff0) * 0x40))
                  (local_fb8,ray,local_1070);
        fVar74 = (local_1080->super_RayK<1>).tfar;
        ray = local_1080;
        fVar31 = fVar74;
        fVar33 = fVar74;
        fVar35 = fVar74;
        fVar50 = local_1068;
        fVar75 = fStack_1064;
        fVar76 = fStack_1060;
        fVar89 = fStack_105c;
        fVar88 = local_1038;
        fVar85 = fStack_1034;
        fVar86 = fStack_1030;
        fVar87 = fStack_102c;
        fVar34 = local_10d8;
        fVar93 = fStack_10d4;
        fVar77 = fStack_10d0;
        fVar79 = fStack_10cc;
        fVar104 = local_1058;
        fVar80 = fStack_1054;
        fVar101 = fStack_1050;
        fVar103 = fStack_104c;
        fVar96 = local_10e8;
        fVar105 = fStack_10e4;
        fVar106 = fStack_10e0;
        fVar107 = fStack_10dc;
        fVar102 = local_10b8;
        fVar108 = fStack_10b4;
        fVar109 = fStack_10b0;
        fVar110 = fStack_10ac;
        fVar94 = local_10c8;
        fVar111 = fStack_10c4;
        fVar91 = fStack_10c0;
        fVar92 = fStack_10bc;
        fVar98 = local_1048;
        fVar97 = fStack_1044;
        fVar99 = fStack_1040;
        fVar100 = fStack_103c;
      }
LAB_00d00c5b:
    } while (pauVar21 != (undefined1 (*) [16])&local_f78);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }